

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::stringify<(anonymous_namespace)::Constructable_const*>
          (string *__return_storage_ptr__,Detail *this,Constructable **e)

{
  size_t in_RCX;
  long local_10;
  
  local_10 = *(long *)this;
  if (local_10 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x6c6c756e;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 3) = 0x7274706c;
    __return_storage_ptr__->_M_string_length = 7;
    (__return_storage_ptr__->field_2)._M_local_buf[7] = '\0';
  }
  else {
    rawMemoryToString_abi_cxx11_(__return_storage_ptr__,(Detail *)&local_10,(void *)0x8,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<std::remove_cv_t<std::remove_reference_t<T>>>::convert(e);
        }